

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xvector.c
# Opt level: O0

void xvec_erase(xvec_t *xv,size_t pos,int count)

{
  uchar *local_28;
  uchar *v;
  int count_local;
  size_t pos_local;
  xvec_t *xv_local;
  
  if ((count < 0) || (xv->size <= pos + (long)count)) {
    if (xv->destroy_cb != (xvec_destroy_cb)0x0) {
      values_destroy(xv,pos,(int)xv->size - (int)pos);
    }
    xv->size = pos;
  }
  else {
    xv->size = xv->size - (long)count;
    if (xv->destroy_cb == (xvec_destroy_cb)0x0) {
      local_28 = xv->data + xv->val_size * (pos + (long)count);
    }
    else {
      local_28 = (uchar *)values_destroy(xv,pos,count);
    }
    memmove(xv->data + xv->val_size * pos,local_28,xv->val_size * (xv->size - pos));
  }
  return;
}

Assistant:

void xvec_erase(xvec_t* xv, size_t pos, int count)
{
    unsigned char* v;

    if (count < 0 || pos + count >= xv->size)
    {
        if (xv->destroy_cb)
            values_destroy(xv, pos, xv->size - pos);

        xv->size = pos;
    }
    else
    {
        xv->size -= count;

        if (xv->destroy_cb)
            v = values_destroy(xv, pos, count);
        else
            v = xvec_at(xv, pos + count);

        /* <<< */
        memmove(xvec_at(xv, pos), v,
                xv->val_size * (xv->size - pos));
    }
}